

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

_Bool av1_cnn_predict_img_multi_out_highbd
                (uint16_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,int bit_depth,CNN_MULTI_OUT *output)

{
  long lVar1;
  float *pfVar2;
  size_t __n;
  uint uVar3;
  uint16_t *puVar4;
  long lVar5;
  _Bool _Var6;
  int in_height;
  int iVar7;
  int iVar8;
  void *memblk;
  long lVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int in_width;
  int iVar23;
  int iVar24;
  float fVar25;
  float *inputs [256];
  float *local_838 [257];
  
  lVar15 = (long)width;
  lVar1 = lVar15 + (long)cnn_config->ext_width * 2;
  uVar3 = cnn_config->layer_config[0].in_channels;
  in_height = height + cnn_config->ext_height * 2;
  in_width = (int)lVar1;
  iVar7 = in_height * in_width;
  memblk = aom_malloc((long)(int)(iVar7 * uVar3) << 2);
  if (memblk == (void *)0x0) {
    _Var6 = false;
  }
  else {
    if (0 < (int)uVar3) {
      fVar25 = (float)~(-1 << ((byte)bit_depth & 0x1f));
      lVar18 = (long)in_width;
      __n = lVar18 * 4;
      lVar5 = (long)stride * 2;
      iVar8 = 0;
      uVar20 = 0;
      do {
        lVar10 = (long)iVar8 * 4;
        pfVar2 = (float *)((long)memblk + (long)(iVar7 * (int)uVar20) * 4);
        local_838[uVar20] = pfVar2;
        iVar23 = cnn_config->ext_height;
        lVar13 = (long)(iVar23 * in_width);
        iVar24 = cnn_config->ext_width;
        lVar9 = (long)iVar24;
        if (cnn_config->strict_bounds == 0) {
          lVar17 = (long)iVar23;
          lVar19 = -lVar17;
          if ((int)lVar19 < iVar23 + height) {
            lVar10 = ((lVar10 + lVar13 * 4) - __n * lVar17) + (long)memblk;
            lVar9 = lVar17 * (long)stride * -2 + lVar9 * -2;
            iVar12 = iVar24 + width;
            do {
              if (iVar12 != -iVar24 && SBORROW4(iVar12,-iVar24) == iVar12 + iVar24 < 0) {
                puVar4 = dgd[uVar20];
                lVar13 = 0;
                do {
                  *(float *)(lVar10 + lVar13 * 4) =
                       (float)*(ushort *)((long)puVar4 + lVar13 * 2 + lVar9) / fVar25;
                  lVar13 = lVar13 + 1;
                } while (width + iVar24 * 2 != (int)lVar13);
              }
              lVar19 = lVar19 + 1;
              lVar10 = lVar10 + __n;
              lVar9 = lVar9 + lVar5;
            } while (iVar23 + height != (int)lVar19);
          }
        }
        else {
          if (0 < height) {
            lVar17 = lVar10 + lVar9 * 4 + lVar13 * 4 + (long)memblk;
            lVar19 = 0;
            uVar21 = 0;
            do {
              if (0 < width) {
                puVar4 = dgd[uVar20];
                uVar22 = 0;
                do {
                  *(float *)(lVar17 + uVar22 * 4) =
                       (float)*(ushort *)((long)puVar4 + uVar22 * 2 + lVar19) / fVar25;
                  uVar22 = uVar22 + 1;
                } while ((uint)width != uVar22);
              }
              uVar21 = uVar21 + 1;
              lVar17 = lVar17 + __n;
              lVar19 = lVar19 + lVar5;
            } while (uVar21 != (uint)height);
          }
          if (0 < height) {
            lVar10 = lVar10 + lVar9 * 4 + lVar13 * 4;
            pfVar14 = (float *)(lVar10 + (long)-iVar24 * 4 + (long)memblk);
            pfVar11 = (float *)((long)memblk + lVar10 + lVar15 * 4);
            uVar21 = 0;
            do {
              if (0 < iVar24) {
                pfVar16 = pfVar14;
                lVar10 = (long)-iVar24;
                do {
                  lVar10 = lVar10 + 1;
                  *pfVar16 = pfVar2[lVar13 + lVar9 + uVar21 * lVar18];
                  pfVar16 = pfVar16 + 1;
                } while ((int)lVar10 != 0);
              }
              if (0 < iVar24) {
                pfVar16 = pfVar11;
                lVar10 = lVar15;
                do {
                  *pfVar16 = pfVar2[lVar13 + lVar9 + lVar15 + uVar21 * lVar18 + -1];
                  lVar10 = lVar10 + 1;
                  pfVar16 = pfVar16 + 1;
                } while (lVar10 < width + iVar24);
              }
              uVar21 = uVar21 + 1;
              pfVar14 = pfVar14 + lVar18;
              pfVar11 = pfVar11 + lVar18;
            } while (uVar21 != (uint)height);
          }
          if (0 < iVar23) {
            iVar24 = -in_width * iVar23;
            do {
              memcpy(pfVar2 + lVar13 + lVar9 + (iVar24 - cnn_config->ext_width),
                     pfVar2 + lVar13 + (lVar9 - cnn_config->ext_width),lVar1 * 4);
              iVar24 = iVar24 + in_width;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
          iVar23 = height * in_width;
          iVar24 = height;
          if (0 < cnn_config->ext_height) {
            do {
              memcpy(pfVar2 + lVar13 + lVar9 + (iVar23 - cnn_config->ext_width),
                     pfVar2 + lVar13 + lVar9 + ((height + -1) * in_width - cnn_config->ext_width),
                     __n);
              iVar24 = iVar24 + 1;
              iVar23 = iVar23 + in_width;
            } while (iVar24 < cnn_config->ext_height + height);
          }
        }
        uVar20 = uVar20 + 1;
        iVar8 = iVar8 + iVar7;
      } while (uVar20 != uVar3);
    }
    _Var6 = av1_cnn_predict_c(local_838,in_width,in_height,in_width,cnn_config,thread_data,output);
    aom_free(memblk);
  }
  return _Var6;
}

Assistant:

bool av1_cnn_predict_img_multi_out_highbd(uint16_t **dgd, int width, int height,
                                          int stride,
                                          const CNN_CONFIG *cnn_config,
                                          const CNN_THREAD_DATA *thread_data,
                                          int bit_depth,
                                          CNN_MULTI_OUT *output) {
  const float max_val = (float)((1 << bit_depth) - 1);

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }

  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}